

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t spvtools::val::CfgPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  spv_result_t sVar4;
  Function *pFVar5;
  BasicBlock *pBVar6;
  Instruction *pIVar7;
  ExecutionModel model;
  char *pcVar8;
  vector<unsigned_int,std::allocator<unsigned_int>> *this;
  size_t i;
  ulong index;
  uint32_t target;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  vector<unsigned_int,std::allocator<unsigned_int>> local_258 [32];
  vector<unsigned_int,std::allocator<unsigned_int>> local_238 [24];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cases;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0xf6:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    sVar4 = MergeBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterLoopMerge(pFVar5,uVar2,uVar3);
    goto LAB_0026f7b3;
  case 0xf7:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar4 = MergeBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterSelectionMerge(pFVar5,uVar2);
LAB_0026f7b3:
    if (sVar4 == SPV_SUCCESS) {
      return SPV_SUCCESS;
    }
    return sVar4;
  case 0xf8:
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterBlock(pFVar5,(inst->inst_).result_id,true);
    if (sVar4 == SPV_SUCCESS) {
      pFVar5 = ValidationState_t::current_function(_);
      pBVar6 = Function::current_block(pFVar5);
      pBVar6->label_ = inst;
      return SPV_SUCCESS;
    }
    return sVar4;
  case 0xf9:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar4 = FirstBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
    this = local_238;
    break;
  case 0xfa:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar4 = FirstBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = FirstBlockAssert(_,uVar3);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar3,uVar2);
    this = local_258;
    break;
  case 0xfb:
    cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (index = 1;
        index < (ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); index = index + 2) {
      target = Instruction::GetOperandAs<unsigned_int>(inst,index);
      sVar4 = FirstBlockAssert(_,target);
      if (sVar4 != SPV_SUCCESS) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return sVar4;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&cases,&target);
    }
    pFVar5 = ValidationState_t::current_function(_);
    this = (vector<unsigned_int,std::allocator<unsigned_int>> *)&cases;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_220,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    Function::RegisterBlockEnd
              (pFVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_220);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_220);
    goto LAB_0026f988;
  case 0xfc:
  case 0xfe:
  case 0xff:
    goto switchD_0026f594_caseD_fc;
  case 0xfd:
    pFVar5 = ValidationState_t::current_function(_);
    pIVar7 = ValidationState_t::FindDef(_,pFVar5->result_type_id_);
    if (pIVar7 == (Instruction *)0x0) {
      __assert_fail("return_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_cfg.cpp"
                    ,0x485,
                    "spv_result_t spvtools::val::CfgPass(ValidationState_t &, const Instruction *)")
      ;
    }
    if ((pIVar7->inst_).opcode != 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&cases,_,SPV_ERROR_INVALID_CFG,inst);
      std::operator<<((ostream *)&cases,"OpReturn can only be called from a function with void ");
      std::operator<<((ostream *)&cases,"return type.");
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&cases);
      return local_38;
    }
    pFVar5 = ValidationState_t::current_function(_);
    this = (vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    Function::RegisterBlockEnd(pFVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    goto LAB_0026f988;
  default:
    if (((0x21 < uVar1 - 0x1140) || ((0x300000001U >> ((ulong)(uVar1 - 0x1140) & 0x3f) & 1) == 0))
       && (uVar1 != 0x14ae)) {
      return SPV_SUCCESS;
    }
switchD_0026f594_caseD_fc:
    pFVar5 = ValidationState_t::current_function(_);
    local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Function::RegisterBlockEnd
              (pFVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_298);
    if (uVar1 == 0x1161) {
      pFVar5 = ValidationState_t::current_function(_);
      pcVar8 = "OpTerminateRayKHR requires AnyHitKHR execution model";
LAB_0026f6c5:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cases,pcVar8,(allocator<char> *)&target);
      model = AnyHitKHR;
    }
    else {
      if (uVar1 == 0x1140) {
        pFVar5 = ValidationState_t::current_function(_);
        pcVar8 = "OpTerminateInvocation requires Fragment execution model";
      }
      else {
        if (uVar1 == 0x1160) {
          pFVar5 = ValidationState_t::current_function(_);
          pcVar8 = "OpIgnoreIntersectionKHR requires AnyHitKHR execution model";
          goto LAB_0026f6c5;
        }
        if (uVar1 != 0xfc) {
          return SPV_SUCCESS;
        }
        pFVar5 = ValidationState_t::current_function(_);
        pcVar8 = "OpKill requires Fragment execution model";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cases,pcVar8,(allocator<char> *)&target);
      model = Fragment;
    }
    Function::RegisterExecutionModelLimitation(pFVar5,model,(string *)&cases);
    std::__cxx11::string::_M_dispose();
    return SPV_SUCCESS;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            (this,&cases);
  Function::RegisterBlockEnd(pFVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
LAB_0026f988:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CfgPass(ValidationState_t& _, const Instruction* inst) {
  spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpLabel:
      if (auto error = _.current_function().RegisterBlock(inst->id()))
        return error;

      // TODO(github:1661) This should be done in the
      // ValidationState::RegisterInstruction method but because of the order of
      // passes the OpLabel ends up not being part of the basic block it starts.
      _.current_function().current_block()->set_label(inst);
      break;
    case spv::Op::OpLoopMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      uint32_t continue_block = inst->GetOperandAs<uint32_t>(1);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterLoopMerge(merge_block,
                                                              continue_block))
        return error;
    } break;
    case spv::Op::OpSelectionMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterSelectionMerge(merge_block))
        return error;
    } break;
    case spv::Op::OpBranch: {
      uint32_t target = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(FirstBlockAssert, target);

      _.current_function().RegisterBlockEnd({target});
    } break;
    case spv::Op::OpBranchConditional: {
      uint32_t tlabel = inst->GetOperandAs<uint32_t>(1);
      uint32_t flabel = inst->GetOperandAs<uint32_t>(2);
      CFG_ASSERT(FirstBlockAssert, tlabel);
      CFG_ASSERT(FirstBlockAssert, flabel);

      _.current_function().RegisterBlockEnd({tlabel, flabel});
    } break;

    case spv::Op::OpSwitch: {
      std::vector<uint32_t> cases;
      for (size_t i = 1; i < inst->operands().size(); i += 2) {
        uint32_t target = inst->GetOperandAs<uint32_t>(i);
        CFG_ASSERT(FirstBlockAssert, target);
        cases.push_back(target);
      }
      _.current_function().RegisterBlockEnd({cases});
    } break;
    case spv::Op::OpReturn: {
      const uint32_t return_type = _.current_function().GetResultTypeId();
      const Instruction* return_type_inst = _.FindDef(return_type);
      assert(return_type_inst);
      if (return_type_inst->opcode() != spv::Op::OpTypeVoid)
        return _.diag(SPV_ERROR_INVALID_CFG, inst)
               << "OpReturn can only be called from a function with void "
               << "return type.";
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      break;
    }
    case spv::Op::OpKill:
    case spv::Op::OpReturnValue:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      // Ops with dedicated passes check for the Execution Model there
      if (opcode == spv::Op::OpKill) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpKill requires Fragment execution model");
      }
      if (opcode == spv::Op::OpTerminateInvocation) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpTerminateInvocation requires Fragment execution model");
      }
      if (opcode == spv::Op::OpIgnoreIntersectionKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpIgnoreIntersectionKHR requires AnyHitKHR execution model");
      }
      if (opcode == spv::Op::OpTerminateRayKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpTerminateRayKHR requires AnyHitKHR execution model");
      }

      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}